

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::DitheringCase::drawAndCheckGradient
          (DitheringCase *this,bool isVerticallyIncreasing,Vec4 *highColor)

{
  RGBA c;
  RenderContext *context;
  byte bVar1;
  int iVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Vec4 *pVVar9;
  Surface *pSVar10;
  long lVar11;
  void *__buf;
  void *__buf_00;
  RGBA c_00;
  undefined7 in_register_00000031;
  char *pcVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char cVar17;
  float s;
  allocator<char> local_311;
  undefined4 local_310;
  allocator<char> local_309;
  TextureFormat local_308;
  DitheringCase *local_300;
  Surface renderedImg;
  Surface errorMask;
  string local_2b8;
  Vec4 inputClr;
  Vec4 local_278;
  undefined1 local_260 [8];
  ostream local_258;
  Random rnd;
  Quad quad;
  
  local_308 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var,iVar5);
  if (0xff < iVar5) {
    iVar5 = 0x100;
  }
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = *(int *)(CONCAT44(extraout_var_00,iVar6) + 4);
  iVar15 = 0x100;
  if (iVar6 < 0x100) {
    iVar15 = iVar6;
  }
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = de::Random::getInt((Random *)&rnd.m_rnd,0,*(int *)CONCAT44(extraout_var_01,iVar6) - iVar5)
  ;
  local_300 = this;
  iVar7 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,0,
                             *(int *)(CONCAT44(extraout_var_02,iVar7) + 4) - iVar15);
  local_278.m_data[0] = 0.0;
  local_278.m_data[1] = 0.0;
  local_278.m_data[2] = 0.0;
  local_278.m_data[3] = 0.0;
  deqp::gls::FragmentOpUtil::Quad::Quad(&quad);
  tcu::Surface::Surface(&renderedImg,iVar5,iVar15);
  glwViewport(iVar6,iVar7,iVar5,iVar15);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportWid, viewportHei)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0xfe);
  local_260._0_4_ = local_308.order;
  local_260._4_4_ = local_308.type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::operator<<(&local_258,"Dithering is ");
  pcVar12 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (local_300->m_ditheringEnabled != false) {
    pcVar12 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::operator<<(&local_258,pcVar12 + 0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  if (local_300->m_ditheringEnabled == true) {
    glwEnable(0xbd0);
    dVar4 = glwGetError();
    iVar16 = 0x103;
    pcVar12 = "glEnable(GL_DITHER)";
  }
  else {
    glwDisable(0xbd0);
    dVar4 = glwGetError();
    iVar16 = 0x105;
    pcVar12 = "glDisable(GL_DITHER)";
  }
  glu::checkError(dVar4,pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,iVar16);
  local_260._0_4_ = local_308.order;
  local_260._4_4_ = local_308.type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::operator<<(&local_258,"Drawing a ");
  pcVar12 = "horizontally";
  if (isVerticallyIncreasing) {
    pcVar12 = "vertically";
  }
  std::operator<<(&local_258,pcVar12);
  std::operator<<(&local_258," increasing gradient");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  quad.color[0].m_data[0] = local_278.m_data[0];
  quad.color[0].m_data[1] = local_278.m_data[1];
  quad.color[0].m_data[2] = local_278.m_data[2];
  quad.color[0].m_data[3] = local_278.m_data[3];
  pVVar9 = &local_278;
  if (isVerticallyIncreasing) {
    pVVar9 = highColor;
  }
  quad.color[1].m_data._0_8_ = *(undefined8 *)pVVar9->m_data;
  quad.color[1].m_data._8_8_ = *(undefined8 *)(pVVar9->m_data + 2);
  pVVar9 = &local_278;
  if (!isVerticallyIncreasing) {
    pVVar9 = highColor;
  }
  quad.color[2].m_data._0_8_ = *(undefined8 *)pVVar9->m_data;
  quad.color[2].m_data._8_8_ = *(undefined8 *)(pVVar9->m_data + 2);
  quad.color[3].m_data._0_8_ = *(undefined8 *)highColor->m_data;
  quad.color[3].m_data._8_8_ = *(undefined8 *)(highColor->m_data + 2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(local_300->m_renderer,&quad);
  context = local_300->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_260,&renderedImg);
  glu::readPixels(context,iVar6,iVar7,(PixelBufferAccess *)local_260);
  GVar8 = glwGetError();
  glu::checkError(GVar8,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDitheringTests.cpp"
                  ,0x111);
  pcVar12 = "HorGradient";
  if (isVerticallyIncreasing) {
    pcVar12 = "VerGradient";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputClr,pcVar12,(allocator<char> *)&errorMask);
  pcVar12 = "Horizontal gradient";
  if (isVerticallyIncreasing) {
    pcVar12 = "Vertical gradient";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar12,&local_311);
  pSVar10 = &renderedImg;
  tcu::LogImage::LogImage
            ((LogImage *)local_260,(string *)&inputClr,&local_2b8,pSVar10,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_260,local_308.order,__buf,(size_t)pSVar10);
  local_310 = (undefined4)CONCAT71(in_register_00000031,isVerticallyIncreasing);
  tcu::LogImage::~LogImage((LogImage *)local_260);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&inputClr);
  tcu::Surface::Surface(&errorMask,iVar5,iVar15);
  bVar13 = true;
  for (iVar5 = 0; iVar5 < renderedImg.m_height; iVar5 = iVar5 + 1) {
    for (iVar6 = 0; iVar6 < renderedImg.m_width; iVar6 = iVar6 + 1) {
      iVar15 = iVar6;
      if ((char)local_310 != '\0') {
        iVar15 = iVar5;
      }
      iVar7 = renderedImg.m_width;
      if ((char)local_310 != '\0') {
        iVar7 = renderedImg.m_height;
      }
      s = ((float)iVar15 + 0.5) / (float)iVar7;
      tcu::operator*((tcu *)local_260,1.0 - s,&local_278);
      tcu::operator*((tcu *)&local_2b8,s,highColor);
      tcu::operator+((tcu *)&inputClr,(Vector<float,_4> *)local_260,(Vector<float,_4> *)&local_2b8);
      local_260._0_4_ =
           *(ChannelOrder *)
            ((long)renderedImg.m_pixels.m_ptr + (long)(renderedImg.m_width * iVar5 + iVar6) * 4);
      bVar3 = checkColor(local_300,&inputClr,(RGBA *)local_260,bVar13);
      lVar11 = (long)(errorMask.m_width * iVar5 + iVar6);
      if (bVar3) {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar11 * 4) = 0xff00ff00;
      }
      else {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar11 * 4) = 0xff0000ff;
        if (bVar13) {
          local_260._0_4_ = local_308.order;
          local_260._4_4_ = local_308.type;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
          std::operator<<(&local_258,"First failure at pixel (");
          std::ostream::operator<<((ostringstream *)&local_258,iVar6);
          std::operator<<(&local_258,", ");
          std::ostream::operator<<((ostringstream *)&local_258,iVar5);
          std::operator<<(&local_258,") (not printing further errors)");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
          bVar13 = false;
        }
      }
    }
  }
  if (bVar13 == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputClr,"ColorChoiceErrorMask",&local_311);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"Error mask for color choices",&local_309);
    pSVar10 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)local_260,(string *)&inputClr,&local_2b8,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_260,local_308.order,__buf_00,(size_t)pSVar10);
    tcu::LogImage::~LogImage((LogImage *)local_260);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&inputClr);
    tcu::Surface::~Surface(&errorMask);
LAB_00ee2842:
    bVar13 = false;
  }
  else {
    tcu::Surface::~Surface(&errorMask);
    bVar13 = true;
    if (local_300->m_ditheringEnabled == false) {
      iVar5 = renderedImg.m_height;
      iVar6 = renderedImg.m_width;
      if ((char)local_310 != '\0') {
        iVar5 = renderedImg.m_width;
        iVar6 = renderedImg.m_height;
      }
      bVar1 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar15 = 0;
      if (0 < iVar6) {
        iVar15 = iVar6;
      }
      for (iVar7 = 0; iVar7 != iVar15; iVar7 = iVar7 + 1) {
        c_00.m_value = 0;
        for (iVar16 = 0; iVar5 != iVar16; iVar16 = iVar16 + 1) {
          iVar14 = iVar16;
          iVar2 = iVar7;
          if ((char)local_310 != '\0') {
            iVar14 = iVar7;
            iVar2 = iVar16;
          }
          c.m_value = *(deUint32 *)
                       ((long)renderedImg.m_pixels.m_ptr +
                       (long)(renderedImg.m_width * iVar14 + iVar2) * 4);
          bVar13 = c.m_value != c_00.m_value && iVar16 != 0;
          if ((bool)(bVar13 & bVar1)) {
            local_260._0_4_ = local_308.order;
            local_260._4_4_ = local_308.type;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
            std::operator<<(&local_258,"Failure: colors should be constant per ");
            pcVar12 = "column";
            if ((char)local_310 != '\0') {
              pcVar12 = "row";
            }
            std::operator<<(&local_258,pcVar12);
            std::operator<<(&local_258," (since dithering is disabled), but the color at position ("
                           );
            std::ostream::operator<<(&local_258,iVar2);
            std::operator<<(&local_258,", ");
            std::ostream::operator<<(&local_258,iVar14);
            std::operator<<(&local_258,") is ");
            tcu::operator<<(&local_258,c);
            std::operator<<(&local_258," and does not equal the color at (");
            cVar17 = (char)local_310;
            iVar5 = iVar7;
            if (cVar17 != '\0') {
              iVar5 = iVar16 + -1;
            }
            std::ostream::operator<<((ostringstream *)&local_258,iVar5);
            std::operator<<(&local_258,", ");
            iVar5 = iVar16 + -1;
            if (cVar17 != '\0') {
              iVar5 = iVar7;
            }
            std::ostream::operator<<((ostringstream *)&local_258,iVar5);
            std::operator<<(&local_258,"), which is ");
            tcu::operator<<(&local_258,c_00);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
            goto LAB_00ee2842;
          }
          bVar1 = bVar1 | bVar13;
          c_00.m_value = c.m_value;
        }
      }
      bVar13 = iVar6 <= iVar7;
    }
  }
  tcu::Surface::~Surface(&renderedImg);
  return bVar13;
}

Assistant:

bool DitheringCase::drawAndCheckGradient (const bool isVerticallyIncreasing, const Vec4& highColor) const
{
	TestLog&					log					= m_testCtx.getLog();
	Random						rnd					(deStringHash(getName()));
	const int					maxViewportWid		= 256;
	const int					maxViewportHei		= 256;
	const int					viewportWid			= de::min(m_renderCtx.getRenderTarget().getWidth(), maxViewportWid);
	const int					viewportHei			= de::min(m_renderCtx.getRenderTarget().getHeight(), maxViewportHei);
	const int					viewportX			= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth() - viewportWid);
	const int					viewportY			= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight() - viewportHei);
	const Vec4					quadClr0			(0.0f, 0.0f, 0.0f, 0.0f);
	const Vec4&					quadClr1			= highColor;
	Quad						quad;
	Surface						renderedImg			(viewportWid, viewportHei);

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportWid, viewportHei));

	log << TestLog::Message << "Dithering is " << (m_ditheringEnabled ? "enabled" : "disabled") << TestLog::EndMessage;

	if (m_ditheringEnabled)
		GLU_CHECK_CALL(glEnable(GL_DITHER));
	else
		GLU_CHECK_CALL(glDisable(GL_DITHER));

	log << TestLog::Message << "Drawing a " << (isVerticallyIncreasing ? "vertically" : "horizontally") << " increasing gradient" << TestLog::EndMessage;

	quad.color[0] = quadClr0;
	quad.color[1] = isVerticallyIncreasing ? quadClr1 : quadClr0;
	quad.color[2] = isVerticallyIncreasing ? quadClr0 : quadClr1;
	quad.color[3] = quadClr1;

	m_renderer->render(quad);

	glu::readPixels(m_renderCtx, viewportX, viewportY, renderedImg.getAccess());
	GLU_CHECK_MSG("glReadPixels()");

	log << TestLog::Image(isVerticallyIncreasing ? "VerGradient"		: "HorGradient",
						  isVerticallyIncreasing ? "Vertical gradient"	: "Horizontal gradient",
						  renderedImg);

	// Validate, at each pixel, that each color channel is one of its two allowed values.

	{
		Surface		errorMask		(viewportWid, viewportHei);
		bool		colorChoicesOk	= true;

		for (int y = 0; y < renderedImg.getHeight(); y++)
		{
			for (int x = 0; x < renderedImg.getWidth(); x++)
			{
				const float		inputF		= ((float)(isVerticallyIncreasing ? y : x) + 0.5f) / (float)(isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth());
				const Vec4		inputClr	= (1.0f-inputF)*quadClr0 + inputF*quadClr1;

				if (!checkColor(inputClr, renderedImg.getPixel(x, y), colorChoicesOk))
				{
					errorMask.setPixel(x, y, tcu::RGBA::red());

					if (colorChoicesOk)
					{
						log << TestLog::Message << "First failure at pixel (" << x << ", " << y << ") (not printing further errors)" << TestLog::EndMessage;
						colorChoicesOk = false;
					}
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA::green());
			}
		}

		if (!colorChoicesOk)
		{
			log << TestLog::Image("ColorChoiceErrorMask", "Error mask for color choices", errorMask);
			return false;
		}
	}

	// When dithering is disabled, the color selection must be coordinate-independent - i.e. the colors must be constant in the gradient's constant direction.

	if (!m_ditheringEnabled)
	{
		const int	increasingDirectionSize	= isVerticallyIncreasing ? renderedImg.getHeight() : renderedImg.getWidth();
		const int	constantDirectionSize	= isVerticallyIncreasing ? renderedImg.getWidth() : renderedImg.getHeight();
		bool		colorHasChanged			= false;

		for (int incrPos = 0; incrPos < increasingDirectionSize; incrPos++)
		{
			tcu::RGBA prevConstantDirectionPix;
			for (int constPos = 0; constPos < constantDirectionSize; constPos++)
			{
				const int			x		= isVerticallyIncreasing ? constPos : incrPos;
				const int			y		= isVerticallyIncreasing ? incrPos : constPos;
				const tcu::RGBA		clr		= renderedImg.getPixel(x, y);

				if (constPos > 0 && clr != prevConstantDirectionPix)
				{
					// Allow color to change once to take into account possibly
					// discontinuity between triangles
					if (colorHasChanged)
					{
						log << TestLog::Message
							<< "Failure: colors should be constant per " << (isVerticallyIncreasing ? "row" : "column")
							<< " (since dithering is disabled), but the color at position (" << x << ", " << y << ") is " << clr
							<< " and does not equal the color at (" << (isVerticallyIncreasing ? x-1 : x) << ", " << (isVerticallyIncreasing ? y : y-1) << "), which is " << prevConstantDirectionPix
							<< TestLog::EndMessage;

						return false;
					}
					else
						colorHasChanged = true;
				}

				prevConstantDirectionPix = clr;
			}
		}
	}

	return true;
}